

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServerBase::OnDisconnect(cmServerBase *this,cmConnection *pConnection)

{
  pointer puVar1;
  cmConnection *pcVar2;
  cmConnection *pcVar3;
  pointer __p;
  pointer puVar4;
  pointer puVar5;
  size_t __n;
  long lVar6;
  void *__buf;
  int __fd;
  int in_R8D;
  iterator __first;
  
  uv_rwlock_wrlock(&this->ConnectionsMutex);
  puVar5 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar1 - (long)puVar5 >> 5;
  puVar4 = puVar5;
  if (0 < lVar6) {
    puVar4 = (pointer)((long)&(puVar5->_M_t).
                              super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>
                              .super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl +
                      ((long)puVar1 - (long)puVar5 & 0xffffffffffffffe0U));
    lVar6 = lVar6 + 1;
    __first._M_current = puVar5 + 2;
    do {
      puVar5 = puVar4;
      if (__first._M_current[-2]._M_t.
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
        __first._M_current = __first._M_current + -2;
        goto LAB_004ad6a7;
      }
      if (__first._M_current[-1]._M_t.
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
        __first._M_current = __first._M_current + -1;
        goto LAB_004ad6a7;
      }
      if (((__first._M_current)->_M_t).
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection)
      goto LAB_004ad6a7;
      if (__first._M_current[1]._M_t.
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
        __first._M_current = __first._M_current + 1;
        goto LAB_004ad6a7;
      }
      lVar6 = lVar6 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar6);
  }
  puVar5 = (pointer)((long)puVar1 - (long)puVar4 >> 3);
  if (puVar5 != (pointer)0x1) {
    if (puVar5 != (pointer)0x2) {
      __first._M_current = puVar1;
      if ((puVar5 != (pointer)0x3) ||
         (__first._M_current = puVar4,
         (puVar4->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t
         .super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
         super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection))
      goto LAB_004ad6a7;
      puVar4 = puVar4 + 1;
    }
    __first._M_current = puVar4;
    if ((puVar4->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) goto LAB_004ad6a7;
    puVar4 = puVar4 + 1;
  }
  __first._M_current = puVar4;
  if ((puVar4->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
      super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
      super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
    __first._M_current = puVar1;
  }
LAB_004ad6a7:
  puVar4 = __first._M_current + 1;
  __n = CONCAT71((int7)((ulong)puVar5 >> 8),puVar4 == puVar1 || __first._M_current == puVar1);
  if (puVar4 != puVar1 && __first._M_current != puVar1) {
    do {
      pcVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
               super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
               super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl;
      if (pcVar2 != pConnection) {
        (puVar4->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl = (cmConnection *)0x0;
        pcVar3 = ((__first._M_current)->_M_t).
                 super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
                 super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
                 super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl;
        ((__first._M_current)->_M_t).
        super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl = pcVar2;
        if (pcVar3 != (cmConnection *)0x0) {
          (*pcVar3->_vptr_cmConnection[2])();
        }
        __first._M_current = __first._M_current + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::_M_erase(&this->Connections,__first,
             (this->Connections).
             super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __fd = (int)__first._M_current;
  uv_rwlock_wrunlock(&this->ConnectionsMutex);
  if ((this->Connections).
      super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Connections).
      super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    auto_async_t::send(&this->ShutdownSignal,__fd,__buf,__n,in_R8D);
    return;
  }
  return;
}

Assistant:

void cmServerBase::OnDisconnect(cmConnection* pConnection)
{
  auto pred = [pConnection](const std::unique_ptr<cmConnection>& m) {
    return m.get() == pConnection;
  };
  uv_rwlock_wrlock(&ConnectionsMutex);
  Connections.erase(
    std::remove_if(Connections.begin(), Connections.end(), pred),
    Connections.end());
  uv_rwlock_wrunlock(&ConnectionsMutex);
  if (Connections.empty()) {
    this->ShutdownSignal.send();
  }
}